

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O1

void __thiscall wallet::MetaPage::Unserialize<AutoFile>(MetaPage *this,AutoFile *s)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  BTreeFlags BVar17;
  int iVar18;
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  uint uVar49;
  runtime_error *this_00;
  size_t in_RCX;
  size_t __nbytes;
  long in_FS_OFFSET;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  uint32_t obj;
  BTreeFlags local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->lsn_file = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->lsn_offset = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->page_num = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->magic = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->version = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->pagesize = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x1,in_RCX);
  this->encrypt_algo = (undefined1)local_24;
  this->other_endian = this->magic == 0x62310500;
  AutoFile::read(s,(int)&local_24,(void *)0x1,in_RCX);
  this->type = (undefined1)local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x1,in_RCX);
  this->metaflags = (undefined1)local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x1,in_RCX);
  this->unused1 = (undefined1)local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->free_list = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->last_page = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->partitions = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->key_count = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->record_count = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  BVar17 = local_24 >> 0x18 | (local_24 & 0xff0000) >> 8 | (local_24 & 0xff00) << 8 |
           local_24 << 0x18;
  if (this->other_endian == false) {
    BVar17 = local_24;
  }
  __nbytes = (size_t)BVar17;
  this->flags = BVar17;
  iVar18 = (int)this;
  AutoFile::read(s,iVar18 + 0x34,(void *)0x14,__nbytes);
  AutoFile::read(s,(int)&local_24,(void *)0x4,__nbytes);
  this->unused2 = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,__nbytes);
  this->minkey = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,__nbytes);
  this->re_len = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,__nbytes);
  this->re_pad = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,__nbytes);
  this->root = local_24;
  AutoFile::read(s,iVar18 + 0x5c,(void *)0x170,__nbytes);
  AutoFile::read(s,(int)&local_24,(void *)0x4,__nbytes);
  this->crypto_magic = local_24;
  AutoFile::read(s,iVar18 + 0x1d0,(void *)0xc,__nbytes);
  AutoFile::read(s,iVar18 + 0x1dc,(void *)0x14,__nbytes);
  AutoFile::read(s,iVar18 + 0x1f0,(void *)0x10,__nbytes);
  if (this->other_endian == true) {
    auVar51._0_4_ = this->lsn_file;
    auVar51._4_4_ = this->lsn_offset;
    auVar51._8_4_ = this->page_num;
    auVar51._12_4_ = this->magic;
    auVar54[1] = 0;
    auVar54[0] = (byte)auVar51._8_4_;
    auVar54[2] = (char)((uint)auVar51._8_4_ >> 8);
    auVar54[3] = 0;
    auVar54[4] = (char)((uint)auVar51._8_4_ >> 0x10);
    auVar54[5] = 0;
    auVar54[6] = (char)((uint)auVar51._8_4_ >> 0x18);
    auVar54[7] = 0;
    auVar54[8] = (char)auVar51._12_4_;
    auVar54[9] = 0;
    auVar54[10] = (char)((uint)auVar51._12_4_ >> 8);
    auVar54[0xb] = 0;
    auVar54[0xc] = (char)((uint)auVar51._12_4_ >> 0x10);
    auVar54[0xd] = 0;
    auVar54[0xe] = (char)((uint)auVar51._12_4_ >> 0x18);
    auVar54[0xf] = 0;
    auVar55 = pshuflw(auVar54,auVar54,0x1b);
    auVar55 = pshufhw(auVar55,auVar55,0x1b);
    auVar19[0xd] = 0;
    auVar19._0_13_ = auVar51._0_13_;
    auVar19[0xe] = (char)((uint)auVar51._4_4_ >> 0x18);
    auVar22[0xc] = (char)((uint)auVar51._4_4_ >> 0x10);
    auVar22._0_12_ = auVar51._0_12_;
    auVar22._13_2_ = auVar19._13_2_;
    auVar25[0xb] = 0;
    auVar25._0_11_ = auVar51._0_11_;
    auVar25._12_3_ = auVar22._12_3_;
    auVar28[10] = (char)((uint)auVar51._4_4_ >> 8);
    auVar28._0_10_ = auVar51._0_10_;
    auVar28._11_4_ = auVar25._11_4_;
    auVar31[9] = 0;
    auVar31._0_9_ = auVar51._0_9_;
    auVar31._10_5_ = auVar28._10_5_;
    auVar34[8] = (char)auVar51._4_4_;
    auVar34._0_8_ = auVar51._0_8_;
    auVar34._9_6_ = auVar31._9_6_;
    auVar40._7_8_ = 0;
    auVar40._0_7_ = auVar34._8_7_;
    auVar43._1_8_ = SUB158(auVar40 << 0x40,7);
    auVar43[0] = (char)((uint)auVar51._0_4_ >> 0x18);
    auVar43._9_6_ = 0;
    auVar44._1_10_ = SUB1510(auVar43 << 0x30,5);
    auVar44[0] = (char)((uint)auVar51._0_4_ >> 0x10);
    auVar44._11_4_ = 0;
    auVar37[2] = (char)((uint)auVar51._0_4_ >> 8);
    auVar37._0_2_ = (ushort)auVar51._0_4_;
    auVar37._3_12_ = SUB1512(auVar44 << 0x20,3);
    auVar50._0_2_ = (ushort)auVar51._0_4_ & 0xff;
    auVar50._2_13_ = auVar37._2_13_;
    auVar50[0xf] = 0;
    auVar51 = pshuflw(auVar50,auVar50,0x1b);
    auVar51 = pshufhw(auVar51,auVar51,0x1b);
    sVar1 = auVar51._0_2_;
    sVar2 = auVar51._2_2_;
    sVar3 = auVar51._4_2_;
    sVar4 = auVar51._6_2_;
    sVar5 = auVar51._8_2_;
    sVar6 = auVar51._10_2_;
    sVar7 = auVar51._12_2_;
    sVar8 = auVar51._14_2_;
    sVar9 = auVar55._0_2_;
    sVar10 = auVar55._2_2_;
    sVar11 = auVar55._4_2_;
    sVar12 = auVar55._6_2_;
    sVar13 = auVar55._8_2_;
    sVar14 = auVar55._10_2_;
    sVar15 = auVar55._12_2_;
    sVar16 = auVar55._14_2_;
    *(char *)&this->lsn_file = (0 < sVar1) * (sVar1 < 0x100) * auVar51[0] - (0xff < sVar1);
    *(char *)((long)&this->lsn_file + 1) =
         (0 < sVar2) * (sVar2 < 0x100) * auVar51[2] - (0xff < sVar2);
    *(char *)((long)&this->lsn_file + 2) =
         (0 < sVar3) * (sVar3 < 0x100) * auVar51[4] - (0xff < sVar3);
    *(char *)((long)&this->lsn_file + 3) =
         (0 < sVar4) * (sVar4 < 0x100) * auVar51[6] - (0xff < sVar4);
    *(char *)&this->lsn_offset = (0 < sVar5) * (sVar5 < 0x100) * auVar51[8] - (0xff < sVar5);
    *(char *)((long)&this->lsn_offset + 1) =
         (0 < sVar6) * (sVar6 < 0x100) * auVar51[10] - (0xff < sVar6);
    *(char *)((long)&this->lsn_offset + 2) =
         (0 < sVar7) * (sVar7 < 0x100) * auVar51[0xc] - (0xff < sVar7);
    *(char *)((long)&this->lsn_offset + 3) =
         (0 < sVar8) * (sVar8 < 0x100) * auVar51[0xe] - (0xff < sVar8);
    *(char *)&this->page_num = (0 < sVar9) * (sVar9 < 0x100) * auVar55[0] - (0xff < sVar9);
    *(char *)((long)&this->page_num + 1) =
         (0 < sVar10) * (sVar10 < 0x100) * auVar55[2] - (0xff < sVar10);
    *(char *)((long)&this->page_num + 2) =
         (0 < sVar11) * (sVar11 < 0x100) * auVar55[4] - (0xff < sVar11);
    *(char *)((long)&this->page_num + 3) =
         (0 < sVar12) * (sVar12 < 0x100) * auVar55[6] - (0xff < sVar12);
    *(char *)&this->magic = (0 < sVar13) * (sVar13 < 0x100) * auVar55[8] - (0xff < sVar13);
    *(char *)((long)&this->magic + 1) =
         (0 < sVar14) * (sVar14 < 0x100) * auVar55[10] - (0xff < sVar14);
    *(char *)((long)&this->magic + 2) =
         (0 < sVar15) * (sVar15 < 0x100) * auVar55[0xc] - (0xff < sVar15);
    *(char *)((long)&this->magic + 3) =
         (0 < sVar16) * (sVar16 < 0x100) * auVar55[0xe] - (0xff < sVar16);
    uVar49 = this->version;
    this->version =
         uVar49 >> 0x18 | (uVar49 & 0xff0000) >> 8 | (uVar49 & 0xff00) << 8 | uVar49 << 0x18;
    uVar49 = this->pagesize;
    this->pagesize =
         uVar49 >> 0x18 | (uVar49 & 0xff0000) >> 8 | (uVar49 & 0xff00) << 8 | uVar49 << 0x18;
    auVar55._0_4_ = this->free_list;
    auVar55._4_4_ = this->last_page;
    auVar55._8_4_ = this->partitions;
    auVar55._12_4_ = this->key_count;
    auVar56[1] = 0;
    auVar56[0] = (byte)auVar55._8_4_;
    auVar56[2] = (char)((uint)auVar55._8_4_ >> 8);
    auVar56[3] = 0;
    auVar56[4] = (char)((uint)auVar55._8_4_ >> 0x10);
    auVar56[5] = 0;
    auVar56[6] = (char)((uint)auVar55._8_4_ >> 0x18);
    auVar56[7] = 0;
    auVar56[8] = (char)auVar55._12_4_;
    auVar56[9] = 0;
    auVar56[10] = (char)((uint)auVar55._12_4_ >> 8);
    auVar56[0xb] = 0;
    auVar56[0xc] = (char)((uint)auVar55._12_4_ >> 0x10);
    auVar56[0xd] = 0;
    auVar56[0xe] = (char)((uint)auVar55._12_4_ >> 0x18);
    auVar56[0xf] = 0;
    auVar51 = pshuflw(auVar56,auVar56,0x1b);
    auVar57 = pshufhw(auVar51,auVar51,0x1b);
    auVar20[0xd] = 0;
    auVar20._0_13_ = auVar55._0_13_;
    auVar20[0xe] = (char)((uint)auVar55._4_4_ >> 0x18);
    auVar23[0xc] = (char)((uint)auVar55._4_4_ >> 0x10);
    auVar23._0_12_ = auVar55._0_12_;
    auVar23._13_2_ = auVar20._13_2_;
    auVar26[0xb] = 0;
    auVar26._0_11_ = auVar55._0_11_;
    auVar26._12_3_ = auVar23._12_3_;
    auVar29[10] = (char)((uint)auVar55._4_4_ >> 8);
    auVar29._0_10_ = auVar55._0_10_;
    auVar29._11_4_ = auVar26._11_4_;
    auVar32[9] = 0;
    auVar32._0_9_ = auVar55._0_9_;
    auVar32._10_5_ = auVar29._10_5_;
    auVar35[8] = (char)auVar55._4_4_;
    auVar35._0_8_ = auVar55._0_8_;
    auVar35._9_6_ = auVar32._9_6_;
    auVar41._7_8_ = 0;
    auVar41._0_7_ = auVar35._8_7_;
    auVar45._1_8_ = SUB158(auVar41 << 0x40,7);
    auVar45[0] = (char)((uint)auVar55._0_4_ >> 0x18);
    auVar45._9_6_ = 0;
    auVar46._1_10_ = SUB1510(auVar45 << 0x30,5);
    auVar46[0] = (char)((uint)auVar55._0_4_ >> 0x10);
    auVar46._11_4_ = 0;
    auVar38[2] = (char)((uint)auVar55._0_4_ >> 8);
    auVar38._0_2_ = (ushort)auVar55._0_4_;
    auVar38._3_12_ = SUB1512(auVar46 << 0x20,3);
    auVar52._0_2_ = (ushort)auVar55._0_4_ & 0xff;
    auVar52._2_13_ = auVar38._2_13_;
    auVar52[0xf] = 0;
    auVar51 = pshuflw(auVar52,auVar52,0x1b);
    auVar51 = pshufhw(auVar51,auVar51,0x1b);
    sVar1 = auVar51._0_2_;
    sVar2 = auVar51._2_2_;
    sVar3 = auVar51._4_2_;
    sVar4 = auVar51._6_2_;
    sVar5 = auVar51._8_2_;
    sVar6 = auVar51._10_2_;
    sVar7 = auVar51._12_2_;
    sVar8 = auVar51._14_2_;
    sVar9 = auVar57._0_2_;
    sVar10 = auVar57._2_2_;
    sVar11 = auVar57._4_2_;
    sVar12 = auVar57._6_2_;
    sVar13 = auVar57._8_2_;
    sVar14 = auVar57._10_2_;
    sVar15 = auVar57._12_2_;
    sVar16 = auVar57._14_2_;
    *(char *)&this->free_list = (0 < sVar1) * (sVar1 < 0x100) * auVar51[0] - (0xff < sVar1);
    *(char *)((long)&this->free_list + 1) =
         (0 < sVar2) * (sVar2 < 0x100) * auVar51[2] - (0xff < sVar2);
    *(char *)((long)&this->free_list + 2) =
         (0 < sVar3) * (sVar3 < 0x100) * auVar51[4] - (0xff < sVar3);
    *(char *)((long)&this->free_list + 3) =
         (0 < sVar4) * (sVar4 < 0x100) * auVar51[6] - (0xff < sVar4);
    *(char *)&this->last_page = (0 < sVar5) * (sVar5 < 0x100) * auVar51[8] - (0xff < sVar5);
    *(char *)((long)&this->last_page + 1) =
         (0 < sVar6) * (sVar6 < 0x100) * auVar51[10] - (0xff < sVar6);
    *(char *)((long)&this->last_page + 2) =
         (0 < sVar7) * (sVar7 < 0x100) * auVar51[0xc] - (0xff < sVar7);
    *(char *)((long)&this->last_page + 3) =
         (0 < sVar8) * (sVar8 < 0x100) * auVar51[0xe] - (0xff < sVar8);
    *(char *)&this->partitions = (0 < sVar9) * (sVar9 < 0x100) * auVar57[0] - (0xff < sVar9);
    *(char *)((long)&this->partitions + 1) =
         (0 < sVar10) * (sVar10 < 0x100) * auVar57[2] - (0xff < sVar10);
    *(char *)((long)&this->partitions + 2) =
         (0 < sVar11) * (sVar11 < 0x100) * auVar57[4] - (0xff < sVar11);
    *(char *)((long)&this->partitions + 3) =
         (0 < sVar12) * (sVar12 < 0x100) * auVar57[6] - (0xff < sVar12);
    *(char *)&this->key_count = (0 < sVar13) * (sVar13 < 0x100) * auVar57[8] - (0xff < sVar13);
    *(char *)((long)&this->key_count + 1) =
         (0 < sVar14) * (sVar14 < 0x100) * auVar57[10] - (0xff < sVar14);
    *(char *)((long)&this->key_count + 2) =
         (0 < sVar15) * (sVar15 < 0x100) * auVar57[0xc] - (0xff < sVar15);
    *(char *)((long)&this->key_count + 3) =
         (0 < sVar16) * (sVar16 < 0x100) * auVar57[0xe] - (0xff < sVar16);
    uVar49 = this->record_count;
    this->record_count =
         uVar49 >> 0x18 | (uVar49 & 0xff0000) >> 8 | (uVar49 & 0xff00) << 8 | uVar49 << 0x18;
    auVar57._0_4_ = this->unused2;
    auVar57._4_4_ = this->minkey;
    auVar57._8_4_ = this->re_len;
    auVar57._12_4_ = this->re_pad;
    auVar58[1] = 0;
    auVar58[0] = (byte)auVar57._8_4_;
    auVar58[2] = (char)((uint)auVar57._8_4_ >> 8);
    auVar58[3] = 0;
    auVar58[4] = (char)((uint)auVar57._8_4_ >> 0x10);
    auVar58[5] = 0;
    auVar58[6] = (char)((uint)auVar57._8_4_ >> 0x18);
    auVar58[7] = 0;
    auVar58[8] = (char)auVar57._12_4_;
    auVar58[9] = 0;
    auVar58[10] = (char)((uint)auVar57._12_4_ >> 8);
    auVar58[0xb] = 0;
    auVar58[0xc] = (char)((uint)auVar57._12_4_ >> 0x10);
    auVar58[0xd] = 0;
    auVar58[0xe] = (char)((uint)auVar57._12_4_ >> 0x18);
    auVar58[0xf] = 0;
    auVar51 = pshuflw(auVar58,auVar58,0x1b);
    auVar55 = pshufhw(auVar51,auVar51,0x1b);
    auVar21[0xd] = 0;
    auVar21._0_13_ = auVar57._0_13_;
    auVar21[0xe] = (char)((uint)auVar57._4_4_ >> 0x18);
    auVar24[0xc] = (char)((uint)auVar57._4_4_ >> 0x10);
    auVar24._0_12_ = auVar57._0_12_;
    auVar24._13_2_ = auVar21._13_2_;
    auVar27[0xb] = 0;
    auVar27._0_11_ = auVar57._0_11_;
    auVar27._12_3_ = auVar24._12_3_;
    auVar30[10] = (char)((uint)auVar57._4_4_ >> 8);
    auVar30._0_10_ = auVar57._0_10_;
    auVar30._11_4_ = auVar27._11_4_;
    auVar33[9] = 0;
    auVar33._0_9_ = auVar57._0_9_;
    auVar33._10_5_ = auVar30._10_5_;
    auVar36[8] = (char)auVar57._4_4_;
    auVar36._0_8_ = auVar57._0_8_;
    auVar36._9_6_ = auVar33._9_6_;
    auVar42._7_8_ = 0;
    auVar42._0_7_ = auVar36._8_7_;
    auVar47._1_8_ = SUB158(auVar42 << 0x40,7);
    auVar47[0] = (char)((uint)auVar57._0_4_ >> 0x18);
    auVar47._9_6_ = 0;
    auVar48._1_10_ = SUB1510(auVar47 << 0x30,5);
    auVar48[0] = (char)((uint)auVar57._0_4_ >> 0x10);
    auVar48._11_4_ = 0;
    auVar39[2] = (char)((uint)auVar57._0_4_ >> 8);
    auVar39._0_2_ = (ushort)auVar57._0_4_;
    auVar39._3_12_ = SUB1512(auVar48 << 0x20,3);
    auVar53._0_2_ = (ushort)auVar57._0_4_ & 0xff;
    auVar53._2_13_ = auVar39._2_13_;
    auVar53[0xf] = 0;
    auVar51 = pshuflw((undefined1  [16])0x0,auVar53,0x1b);
    auVar51 = pshufhw(auVar51,auVar51,0x1b);
    sVar1 = auVar51._0_2_;
    sVar2 = auVar51._2_2_;
    sVar3 = auVar51._4_2_;
    sVar4 = auVar51._6_2_;
    sVar5 = auVar51._8_2_;
    sVar6 = auVar51._10_2_;
    sVar7 = auVar51._12_2_;
    sVar8 = auVar51._14_2_;
    sVar9 = auVar55._0_2_;
    sVar10 = auVar55._2_2_;
    sVar11 = auVar55._4_2_;
    sVar12 = auVar55._6_2_;
    sVar13 = auVar55._8_2_;
    sVar14 = auVar55._10_2_;
    sVar15 = auVar55._12_2_;
    sVar16 = auVar55._14_2_;
    *(char *)&this->unused2 = (0 < sVar1) * (sVar1 < 0x100) * auVar51[0] - (0xff < sVar1);
    *(char *)((long)&this->unused2 + 1) =
         (0 < sVar2) * (sVar2 < 0x100) * auVar51[2] - (0xff < sVar2);
    *(char *)((long)&this->unused2 + 2) =
         (0 < sVar3) * (sVar3 < 0x100) * auVar51[4] - (0xff < sVar3);
    *(char *)((long)&this->unused2 + 3) =
         (0 < sVar4) * (sVar4 < 0x100) * auVar51[6] - (0xff < sVar4);
    *(char *)&this->minkey = (0 < sVar5) * (sVar5 < 0x100) * auVar51[8] - (0xff < sVar5);
    *(char *)((long)&this->minkey + 1) =
         (0 < sVar6) * (sVar6 < 0x100) * auVar51[10] - (0xff < sVar6);
    *(char *)((long)&this->minkey + 2) =
         (0 < sVar7) * (sVar7 < 0x100) * auVar51[0xc] - (0xff < sVar7);
    *(char *)((long)&this->minkey + 3) =
         (0 < sVar8) * (sVar8 < 0x100) * auVar51[0xe] - (0xff < sVar8);
    *(char *)&this->re_len = (0 < sVar9) * (sVar9 < 0x100) * auVar55[0] - (0xff < sVar9);
    *(char *)((long)&this->re_len + 1) =
         (0 < sVar10) * (sVar10 < 0x100) * auVar55[2] - (0xff < sVar10);
    *(char *)((long)&this->re_len + 2) =
         (0 < sVar11) * (sVar11 < 0x100) * auVar55[4] - (0xff < sVar11);
    *(char *)((long)&this->re_len + 3) =
         (0 < sVar12) * (sVar12 < 0x100) * auVar55[6] - (0xff < sVar12);
    *(char *)&this->re_pad = (0 < sVar13) * (sVar13 < 0x100) * auVar55[8] - (0xff < sVar13);
    *(char *)((long)&this->re_pad + 1) =
         (0 < sVar14) * (sVar14 < 0x100) * auVar55[10] - (0xff < sVar14);
    *(char *)((long)&this->re_pad + 2) =
         (0 < sVar15) * (sVar15 < 0x100) * auVar55[0xc] - (0xff < sVar15);
    *(char *)((long)&this->re_pad + 3) =
         (0 < sVar16) * (sVar16 < 0x100) * auVar55[0xe] - (0xff < sVar16);
    uVar49 = this->root;
    this->root = uVar49 >> 0x18 | (uVar49 & 0xff0000) >> 8 | (uVar49 & 0xff00) << 8 | uVar49 << 0x18
    ;
    uVar49 = this->crypto_magic;
    this->crypto_magic =
         uVar49 >> 0x18 | (uVar49 & 0xff0000) >> 8 | (uVar49 & 0xff00) << 8 | uVar49 << 0x18;
  }
  if (this->page_num == this->expected_page_num) {
    if (this->magic == 0x53162) {
      if (this->version == 9) {
        uVar49 = this->pagesize;
        if (uVar49 - 0x200 < 0xfe01) {
          uVar49 = uVar49 - (uVar49 >> 1 & 0x55555555);
          uVar49 = (uVar49 >> 2 & 0x33333333) + (uVar49 & 0x33333333);
          if (((uVar49 >> 4) + uVar49 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2) {
            if (this->type == BTREE_META) {
              if (this->flags == SUBDB) {
                if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
                  return;
                }
                goto LAB_00c9a900;
              }
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (this_00,"Unexpected database flags, should only be 0x20 (subdatabases)");
            }
            else {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (this_00,"Unexpected page type, should be 9 (BTree Metadata)");
            }
            goto LAB_00c9a895;
          }
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Bad page size");
      }
      else {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Unsupported BDB data file version number");
      }
    }
    else {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Not a BDB file");
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Meta page number mismatch");
  }
LAB_00c9a895:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_00c9a900:
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        s >> lsn_file;
        s >> lsn_offset;
        s >> page_num;
        s >> magic;
        s >> version;
        s >> pagesize;
        s >> encrypt_algo;

        other_endian = magic == BTREE_MAGIC_OE;

        uint8_t uint8_type;
        s >> uint8_type;
        type = static_cast<PageType>(uint8_type);

        s >> metaflags;
        s >> unused1;
        s >> free_list;
        s >> last_page;
        s >> partitions;
        s >> key_count;
        s >> record_count;

        uint32_t uint32_flags;
        s >> uint32_flags;
        if (other_endian) {
            uint32_flags = internal_bswap_32(uint32_flags);
        }
        flags = static_cast<BTreeFlags>(uint32_flags);

        s >> uid;
        s >> unused2;
        s >> minkey;
        s >> re_len;
        s >> re_pad;
        s >> root;
        s >> unused3;
        s >> crypto_magic;
        s >> trash;
        s >> iv;
        s >> chksum;

        if (other_endian) {
            lsn_file = internal_bswap_32(lsn_file);
            lsn_offset = internal_bswap_32(lsn_offset);
            page_num = internal_bswap_32(page_num);
            magic = internal_bswap_32(magic);
            version = internal_bswap_32(version);
            pagesize = internal_bswap_32(pagesize);
            free_list = internal_bswap_32(free_list);
            last_page = internal_bswap_32(last_page);
            partitions = internal_bswap_32(partitions);
            key_count = internal_bswap_32(key_count);
            record_count = internal_bswap_32(record_count);
            unused2 = internal_bswap_32(unused2);
            minkey = internal_bswap_32(minkey);
            re_len = internal_bswap_32(re_len);
            re_pad = internal_bswap_32(re_pad);
            root = internal_bswap_32(root);
            crypto_magic = internal_bswap_32(crypto_magic);
        }

        // Page number must match
        if (page_num != expected_page_num) {
            throw std::runtime_error("Meta page number mismatch");
        }

        // Check magic
        if (magic != BTREE_MAGIC) {
            throw std::runtime_error("Not a BDB file");
        }

        // Only version 9 is supported
        if (version != 9) {
            throw std::runtime_error("Unsupported BDB data file version number");
        }

        // Page size must be 512 <= pagesize <= 64k, and be a power of 2
        if (pagesize < 512 || pagesize > 65536 || (pagesize & (pagesize - 1)) != 0) {
            throw std::runtime_error("Bad page size");
        }

        // Page type must be the btree type
        if (type != PageType::BTREE_META) {
            throw std::runtime_error("Unexpected page type, should be 9 (BTree Metadata)");
        }

        // Only supported meta-flag is subdatabase
        if (flags != BTreeFlags::SUBDB) {
            throw std::runtime_error("Unexpected database flags, should only be 0x20 (subdatabases)");
        }
    }